

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetResMonParams(void *kinmem,sunrealtype omegamin,sunrealtype omegamax)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x233;
  }
  else if (0.0 <= omegamin) {
    *(ulong *)((long)kinmem + 0x298) =
         ~-(ulong)(omegamin == 0.0) & (ulong)omegamin |
         -(ulong)(omegamin == 0.0) & 0x3ee4f8b588e368f1;
    if (0.0 <= omegamax) {
      if ((omegamax != 0.0) || (NAN(omegamax))) {
        if (*(double *)((long)kinmem + 0x298) <= omegamax) {
          *(sunrealtype *)((long)kinmem + 0x2a0) = omegamax;
          return 0;
        }
        msgfmt = "scalars < 0 illegal.";
        iVar1 = -2;
        error_code = -2;
        line = 0x25c;
      }
      else {
        if (*(double *)((long)kinmem + 0x298) <= 0.9) {
          *(undefined8 *)((long)kinmem + 0x2a0) = 0x3feccccccccccccd;
          return 0;
        }
        msgfmt = "scalars < 0 illegal.";
        iVar1 = -2;
        error_code = -2;
        line = 0x252;
      }
    }
    else {
      msgfmt = "scalars < 0 illegal.";
      iVar1 = -2;
      error_code = -2;
      line = 0x249;
    }
  }
  else {
    msgfmt = "scalars < 0 illegal.";
    iVar1 = -2;
    error_code = -2;
    line = 0x23d;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetResMonParams",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int KINSetResMonParams(void* kinmem, sunrealtype omegamin, sunrealtype omegamax)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  /* check omegamin */

  if (omegamin < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_OMEGA);
    return (KIN_ILL_INPUT);
  }

  if (omegamin == ZERO) { kin_mem->kin_omega_min = OMEGA_MIN; }
  else { kin_mem->kin_omega_min = omegamin; }

  /* check omegamax */

  if (omegamax < ZERO)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_OMEGA);
    return (KIN_ILL_INPUT);
  }

  if (omegamax == ZERO)
  {
    if (kin_mem->kin_omega_min > OMEGA_MAX)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_OMEGA);
      return (KIN_ILL_INPUT);
    }
    else { kin_mem->kin_omega_max = OMEGA_MAX; }
  }
  else
  {
    if (kin_mem->kin_omega_min > omegamax)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_OMEGA);
      return (KIN_ILL_INPUT);
    }
    else { kin_mem->kin_omega_max = omegamax; }
  }

  return (KIN_SUCCESS);
}